

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::doAddRow(SPxLPBase<double> *this,LPRowBase<double> *row,bool scale)

{
  double dVar1;
  LPColSetBase<double> *this_00;
  int iVar2;
  SPxScaler<double> *pSVar3;
  Nonzero<double> *pNVar4;
  bool bVar5;
  SPxLPBase<double> *pSVar6;
  double *pdVar7;
  undefined7 in_register_00000011;
  int iVar8;
  double dVar9;
  double dVar10;
  int idx;
  double val;
  LPColBase<double> empty;
  int local_b0;
  int local_ac;
  _func_int **local_a8;
  Item *local_a0;
  SPxLPBase<double> *local_98;
  int local_90;
  int local_8c;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  DataKey local_70;
  LPColBase<double> local_68;
  
  local_b0 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_90 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_68.up = -NAN;
  LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,(DataKey *)&local_68,row);
  local_a0 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
             (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[local_b0].idx;
  local_ac = 0;
  local_8c = (int)CONCAT71(in_register_00000011,scale);
  if ((local_8c != 0) && (pSVar3 = this->lp_scaler, pSVar3 != (SPxScaler<double> *)0x0)) {
    local_ac = (*pSVar3->_vptr_SPxScaler[1])
                         (pSVar3,local_a0,&(this->super_LPColSetBase<double>).scaleExp);
    local_a8 = (_func_int **)
               (this->super_LPRowSetBase<double>).right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[local_b0];
    ::soplex::infinity::__tls_init();
    pdVar7 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_88 = *pdVar7;
    uStack_80 = 0;
    if ((double)local_a8 < local_88) {
      dVar9 = ldexp((this->super_LPRowSetBase<double>).right.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[local_b0],local_ac);
      (this->super_LPRowSetBase<double>).right.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [local_b0] = dVar9;
    }
    local_a8 = (_func_int **)
               (this->super_LPRowSetBase<double>).left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[local_b0];
    ::soplex::infinity::__tls_init();
    if (-local_88 < (double)local_a8) {
      dVar9 = ldexp((this->super_LPRowSetBase<double>).left.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[local_b0],local_ac);
      (this->super_LPRowSetBase<double>).left.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [local_b0] = dVar9;
    }
    iVar2 = local_ac;
    dVar9 = ldexp((this->super_LPRowSetBase<double>).object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[local_b0],local_ac);
    (this->super_LPRowSetBase<double>).object.val.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [local_b0] = dVar9;
    (this->super_LPRowSetBase<double>).scaleExp.data[local_b0] = iVar2;
  }
  dVar9 = (double)(long)(local_a0->data).super_SVectorBase<double>.memused;
  if (0 < (long)dVar9) {
    this_00 = &this->super_LPColSetBase<double>;
    local_a8 = (_func_int **)&PTR__DSVectorBase_003b0660;
    local_98 = this;
    do {
      dVar1 = (double)((long)dVar9 + -1);
      pNVar4 = (local_a0->data).super_SVectorBase<double>.m_elem;
      iVar2 = pNVar4[(long)dVar1].idx;
      local_88 = dVar1;
      if ((char)local_8c != '\0') {
        dVar10 = ldexp(pNVar4[(long)dVar1].val,
                       (local_98->super_LPColSetBase<double>).scaleExp.data[iVar2] + local_ac);
        (local_a0->data).super_SVectorBase<double>.m_elem[(long)dVar1].val = dVar10;
      }
      pSVar6 = local_98;
      local_78 = (local_a0->data).super_SVectorBase<double>.m_elem[(long)dVar1].val;
      if ((local_98->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar2) {
        LPColBase<double>::LPColBase(&local_68,0);
        iVar8 = (pSVar6->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
        if (iVar8 <= iVar2) {
          iVar8 = (iVar2 - iVar8) + 1;
          do {
            local_70.info = 0;
            local_70.idx = -1;
            LPColSetBase<double>::add(this_00,&local_70,&local_68);
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        local_68.vec._vptr_DSVectorBase = local_a8;
        if (local_68.vec.theelem != (Nonzero<double> *)0x0) {
          free(local_68.vec.theelem);
          local_68.vec.theelem = (Nonzero<double> *)0x0;
        }
      }
      this = local_98;
      SVSetBase<double>::add2
                (&this_00->super_SVSetBase<double>,
                 (SVectorBase<double> *)
                 ((local_98->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                 (local_98->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[iVar2].
                 idx),1,&local_b0,&local_78);
      bVar5 = 1 < (long)dVar9;
      dVar9 = local_88;
    } while (bVar5);
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])(this,1);
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])
            (this,(ulong)(uint)((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                                thenum - local_90));
  return;
}

Assistant:

void doAddRow(const LPRowBase<R>& row, bool scale = false)
   {
      int idx = nRows();
      int oldColNumber = nCols();
      int newRowScaleExp = 0;

      LPRowSetBase<R>::add(row);

      SVectorBase<R>& vec = rowVector_w(idx);

      DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

      // compute new row scaling factor and apply it to the sides
      if(scale && lp_scaler)
      {
         newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

         if(rhs(idx) < R(infinity))
            rhs_w(idx) = spxLdexp(rhs_w(idx), newRowScaleExp);

         if(lhs(idx) > R(-infinity))
            lhs_w(idx) = spxLdexp(lhs_w(idx), newRowScaleExp);

         maxRowObj_w(idx) = spxLdexp(maxRowObj_w(idx), newRowScaleExp);

         LPRowSetBase<R>::scaleExp[idx] = newRowScaleExp;
      }

      // now insert nonzeros to column file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new row and existing column scaling factors to new values in RowSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[i]);

         R val = vec.value(j);

         // create new columns if required
         if(i >= nCols())
         {
            LPColBase<R> empty;

            for(int k = nCols(); k <= i; ++k)
               LPColSetBase<R>::add(empty);
         }

         assert(i < nCols());
         LPColSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedRows(1);
      addedCols(nCols() - oldColNumber);
   }